

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

float spirv_cross::SPIRConstant::f16_to_f32(uint16_t u16_value)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  undefined6 in_register_0000003a;
  ulong uVar5;
  
  uVar5 = CONCAT62(in_register_0000003a,u16_value);
  uVar1 = (uint)(uVar5 >> 0xf) & 0x1ffff;
  uVar2 = (uint)(uVar5 >> 10) & 0x1f;
  uVar4 = (uint)uVar5 & 0x3ff;
  if (uVar2 == 0x1f) {
    uVar1 = uVar1 << 0x1f;
    if ((u16_value & 0x3ff) != 0) {
      uVar1 = uVar1 | (uint)uVar5 << 0xd;
    }
    fVar3 = (float)(uVar1 | 0x7f800000);
  }
  else {
    if ((u16_value & 0x7c00) == 0) {
      if ((u16_value & 0x3ff) == 0) {
        return (float)(uVar1 << 0x1f);
      }
      uVar2 = 1;
      for (; (uVar4 >> 10 & 1) == 0; uVar4 = uVar4 * 2) {
        uVar2 = uVar2 - 1;
      }
      uVar4 = uVar4 & 0xfffffbff;
    }
    fVar3 = (float)(uVar2 * 0x800000 + 0x38000000 | uVar1 << 0x1f | uVar4 << 0xd);
  }
  return fVar3;
}

Assistant:

static inline float f16_to_f32(uint16_t u16_value)
	{
		// Based on the GLM implementation.
		int s = (u16_value >> 15) & 0x1;
		int e = (u16_value >> 10) & 0x1f;
		int m = (u16_value >> 0) & 0x3ff;

		union
		{
			float f32;
			uint32_t u32;
		} u;

		if (e == 0)
		{
			if (m == 0)
			{
				u.u32 = uint32_t(s) << 31;
				return u.f32;
			}
			else
			{
				while ((m & 0x400) == 0)
				{
					m <<= 1;
					e--;
				}

				e++;
				m &= ~0x400;
			}
		}
		else if (e == 31)
		{
			if (m == 0)
			{
				u.u32 = (uint32_t(s) << 31) | 0x7f800000u;
				return u.f32;
			}
			else
			{
				u.u32 = (uint32_t(s) << 31) | 0x7f800000u | (m << 13);
				return u.f32;
			}
		}

		e += 127 - 15;
		m <<= 13;
		u.u32 = (uint32_t(s) << 31) | (e << 23) | m;
		return u.f32;
	}